

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O1

void __thiscall AixLog::Log::~Log(Log *this)

{
  ~Log(this);
  operator_delete(this,0x170);
  return;
}

Assistant:

virtual ~Log() { sync(); }